

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O0

bool FastPForLib::Simple16<false>::trymefull<28u,1u>(uint32_t *n)

{
  uint32_t i;
  uint32_t min;
  uint32_t *n_local;
  
  i = 0;
  while( true ) {
    if (0x1b < i) {
      return true;
    }
    if (1 < n[i]) break;
    i = i + 1;
  }
  return false;
}

Assistant:

static bool trymefull(const uint32_t *n) {
    const uint32_t min = num1;
    for (uint32_t i = 0; i < min; i++) {
      if (n[i] >= (1U << log1))
        return false;
    }
    return true;
  }